

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

_Bool GPU_IntersectClipRect(GPU_Target *target,GPU_Rect B,GPU_Rect *result)

{
  undefined1 auVar1 [16];
  GPU_Rect A;
  GPU_Rect *result_local;
  GPU_Target *target_local;
  GPU_Rect B_local;
  
  if (target == (GPU_Target *)0x0) {
    B_local.w._3_1_ = false;
  }
  else if ((target->use_clip_rect & 1U) == 0) {
    auVar1._4_4_ = (float)target->h;
    auVar1._0_4_ = (float)target->w;
    auVar1._8_8_ = 0;
    B_local.w._3_1_ = GPU_IntersectRect((GPU_Rect)(auVar1 << 0x40),B,result);
  }
  else {
    B_local.w._3_1_ = GPU_IntersectRect(target->clip_rect,B,result);
  }
  return B_local.w._3_1_;
}

Assistant:

GPU_bool GPU_IntersectClipRect(GPU_Target* target, GPU_Rect B, GPU_Rect* result)
{
    if(target == NULL)
        return GPU_FALSE;
    
    if(!target->use_clip_rect)
    {
        GPU_Rect A = {0, 0, target->w, target->h};
        return GPU_IntersectRect(A, B, result);
    }
    
    return GPU_IntersectRect(target->clip_rect, B, result);
}